

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O1

int tconcat(lua_State *L)

{
  lua_Integer lVar1;
  char *s;
  lua_Integer i;
  lua_Integer lVar2;
  size_t lsep;
  luaL_Buffer b;
  size_t local_450;
  luaL_Buffer local_448;
  
  checktab(L,1,5);
  lVar1 = luaL_len(L,1);
  s = luaL_optlstring(L,2,"",&local_450);
  i = luaL_optinteger(L,3,1);
  lVar2 = luaL_optinteger(L,4,lVar1);
  luaL_buffinit(L,&local_448);
  lVar1 = i;
  if (i < lVar2) {
    do {
      addfield(L,&local_448,i);
      luaL_addlstring(&local_448,s,local_450);
      i = i + 1;
      lVar1 = lVar2;
    } while (lVar2 != i);
  }
  if (lVar1 == lVar2) {
    addfield(L,&local_448,lVar1);
  }
  luaL_pushresult(&local_448);
  return 1;
}

Assistant:

static int tconcat (lua_State *L) {
  luaL_Buffer b;
  lua_Integer last = aux_getn(L, 1, TAB_R);
  size_t lsep;
  const char *sep = luaL_optlstring(L, 2, "", &lsep);
  lua_Integer i = luaL_optinteger(L, 3, 1);
  last = luaL_optinteger(L, 4, last);
  luaL_buffinit(L, &b);
  for (; i < last; i++) {
    addfield(L, &b, i);
    luaL_addlstring(&b, sep, lsep);
  }
  if (i == last)  /* add last value (if interval was not empty) */
    addfield(L, &b, i);
  luaL_pushresult(&b);
  return 1;
}